

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

ssize_t archive_acl_text_len
                  (archive_acl *acl,wchar_t want_type,wchar_t flags,wchar_t wide,archive *a,
                  archive_string_conv *sc)

{
  wchar_t wVar1;
  wchar_t wVar2;
  size_t sVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  archive_acl_entry *paVar10;
  size_t len;
  wchar_t *wname;
  char *name;
  
  paVar10 = (archive_acl_entry *)&acl->acl_head;
  iVar7 = 0;
  lVar8 = 0;
  do {
    do {
      lVar6 = 9;
      paVar10 = paVar10->next;
      if (paVar10 == (archive_acl_entry *)0x0) {
        if (((uint)want_type >> 8 & 1) == 0) {
          if (iVar7 == 0) {
            lVar8 = 0;
          }
        }
        else if ((flags & 4U) == 0) {
          lVar8 = lVar8 + 0x20;
        }
        else {
          lVar8 = lVar8 + 0x1f;
        }
        return lVar8;
      }
      wVar2 = paVar10->type;
    } while (((wVar2 & want_type) == 0) ||
            (((wVar1 = paVar10->tag, wVar2 == L'Ā' && ((uint)(wVar1 + L'\xffffd8ee') < 5)) &&
             ((0x15U >> (wVar1 + L'\xffffd8ee' & 0x1fU) & 1) != 0))));
    lVar8 = lVar8 + (ulong)((uint)(wVar2 & want_type) >> 6 & 8);
    switch(wVar1) {
    case L'✑':
    case L'✕':
switchD_00164fa4_caseD_2711:
      lVar8 = lVar8 + 4;
      break;
    case L'✒':
      lVar6 = 6;
      if (want_type != L'㰀') goto switchD_00164fa4_caseD_2711;
LAB_00164fd2:
      lVar9 = lVar8 + lVar6 + 1;
      lVar8 = lVar8 + lVar6;
      goto LAB_00165042;
    case L'✔':
      lVar6 = 6;
      if (want_type == L'㰀') goto LAB_00164fd2;
    case L'✓':
    case L'✖':
      lVar8 = lVar8 + 5;
      break;
    default:
      if (wVar1 == L'❻') goto LAB_00164fd2;
    }
    lVar9 = lVar8 + 1;
    if ((wVar1 | 2U) == 0x2713) {
      if (wide == L'\0') {
        wVar2 = archive_mstring_get_mbs_l(&paVar10->name,&name,&len,sc);
        if (wVar2 != L'\0') {
          return 0;
        }
        if ((len == 0) || (name == (char *)0x0)) goto LAB_0016509c;
        lVar9 = len + lVar9;
      }
      else {
        wVar2 = archive_mstring_get_wcs(a,&paVar10->name,&wname);
        if (wname == (wchar_t *)0x0 || wVar2 != L'\0') {
          if ((wVar2 < L'\0') && (piVar4 = __errno_location(), *piVar4 == 0xc)) {
            return 0;
          }
LAB_0016509c:
          lVar9 = lVar8 + 0xe;
        }
        else {
          sVar3 = wcslen(wname);
          lVar9 = sVar3 + lVar9;
        }
      }
      lVar8 = lVar9 + 1;
    }
    else {
LAB_00165042:
      lVar8 = lVar8 + 2;
      if (want_type == L'㰀') {
        lVar8 = lVar9;
      }
    }
    if ((want_type & 0x300U) != 0 && (flags & 4U) != 0) {
      lVar8 = lVar8 - (ulong)((uint)(paVar10->tag + L'\xffffd8eb') < 2);
    }
    if (want_type == L'㰀') {
      lVar8 = lVar8 + 0x1b + (ulong)((paVar10->type & L'ࠀ') == L'\0');
    }
    else {
      lVar8 = lVar8 + 3;
    }
    if (((paVar10->tag | 2U) == 0x2713) && ((flags & 1U) != 0)) {
      lVar8 = lVar8 + 2;
      for (uVar5 = (ulong)(uint)paVar10->id; 9 < (int)uVar5; uVar5 = uVar5 / 10) {
        lVar8 = lVar8 + 1;
      }
    }
    iVar7 = iVar7 + 1;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

static ssize_t
archive_acl_text_len(struct archive_acl *acl, int want_type, int flags,
    int wide, struct archive *a, struct archive_string_conv *sc) {
	struct archive_acl_entry *ap;
	const char *name;
	const wchar_t *wname;
	int count, idlen, tmp, r;
	ssize_t length;
	size_t len;

	count = 0;
	length = 0;
	for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
		if ((ap->type & want_type) == 0)
			continue;
		/*
		 * Filemode-mapping ACL entries are stored exclusively in
		 * ap->mode so they should not be in the list
		 */
		if ((ap->type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS)
		    && (ap->tag == ARCHIVE_ENTRY_ACL_USER_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_OTHER))
			continue;
		count++;
		if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0
		    && (ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0)
			length += 8; /* "default:" */
		switch (ap->tag) {
		case ARCHIVE_ENTRY_ACL_USER_OBJ:
			if (want_type == ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
				length += 6; /* "owner@" */
				break;
			}
			/* FALLTHROUGH */
		case ARCHIVE_ENTRY_ACL_USER:
		case ARCHIVE_ENTRY_ACL_MASK:
			length += 4; /* "user", "mask" */
			break;
		case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
			if (want_type == ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
				length += 6; /* "group@" */
				break;
			}
			/* FALLTHROUGH */
		case ARCHIVE_ENTRY_ACL_GROUP:
		case ARCHIVE_ENTRY_ACL_OTHER:
			length += 5; /* "group", "other" */
			break;
		case ARCHIVE_ENTRY_ACL_EVERYONE:
			length += 9; /* "everyone@" */
			break;
		}
		length += 1; /* colon after tag */
		if (ap->tag == ARCHIVE_ENTRY_ACL_USER ||
		    ap->tag == ARCHIVE_ENTRY_ACL_GROUP) {
			if (wide) {
				r = archive_mstring_get_wcs(a, &ap->name,
				    &wname);
				if (r == 0 && wname != NULL)
					length += wcslen(wname);
				else if (r < 0 && errno == ENOMEM)
					return (0);
				else
					length += sizeof(uid_t) * 3 + 1;
			} else {
				r = archive_mstring_get_mbs_l(&ap->name, &name,
				    &len, sc);
				if (r != 0)
					return (0);
				if (len > 0 && name != NULL)
					length += len;
				else
					length += sizeof(uid_t) * 3 + 1;
			}
			length += 1; /* colon after user or group name */
		} else if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4)
			length += 1; /* 2nd colon empty user,group or other */

		if (((flags & ARCHIVE_ENTRY_ACL_STYLE_SOLARIS) != 0)
		    && ((want_type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0)
		    && (ap->tag == ARCHIVE_ENTRY_ACL_OTHER
		    || ap->tag == ARCHIVE_ENTRY_ACL_MASK)) {
			/* Solaris has no colon after other: and mask: */
			length = length - 1;
		}

		if (want_type == ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* rwxpdDaARWcCos:fdinSFI:deny */
			length += 27;
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_DENY) == 0)
				length += 1; /* allow, alarm, audit */
		} else
			length += 3; /* rwx */

		if ((ap->tag == ARCHIVE_ENTRY_ACL_USER ||
		    ap->tag == ARCHIVE_ENTRY_ACL_GROUP) &&
		    (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID) != 0) {
			length += 1; /* colon */
			/* ID digit count */
			idlen = 1;
			tmp = ap->id;
			while (tmp > 9) {
				tmp = tmp / 10;
				idlen++;
			}
			length += idlen;
		}
		length ++; /* entry separator */
	}

	/* Add filemode-mapping access entries to the length */
	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		if ((flags & ARCHIVE_ENTRY_ACL_STYLE_SOLARIS) != 0) {
			/* "user::rwx\ngroup::rwx\nother:rwx\n" */
			length += 31;
		} else {
			/* "user::rwx\ngroup::rwx\nother::rwx\n" */
			length += 32;
		}
	} else if (count == 0)
		return (0);

	/* The terminating character is included in count */
	return (length);
}